

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ctl.c
# Opt level: O2

int gost_set_default_param(int param,char *value)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = 0;
  if ((uint)param < 3) {
    pcVar2 = getenv(gost_envnames[(uint)param]);
    if (pcVar2 != (char *)0x0) {
      value = pcVar2;
    }
    CRYPTO_free(gost_params[(uint)param]);
    pcVar2 = CRYPTO_strdup(value,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ctl.c"
                           ,0x4a);
    gost_params[(uint)param] = pcVar2;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int gost_set_default_param(int param, const char *value)
{
    const char *tmp;
    if (param < 0 || param >= GOST_PARAM_MAX)
        return 0;
    tmp = getenv(gost_envnames[param]);

    /*
     * if there is value in the environment, use it, else -passed string *
     */
    if (!tmp) {
        tmp = value;
    }
    OPENSSL_free(gost_params[param]);
    gost_params[param] = BUF_strdup(tmp);

    return 1;
}